

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O3

RC __thiscall QL_NodeSel::SetUpNode(QL_NodeSel *this,int numConds)

{
  undefined8 *puVar1;
  RC RVar2;
  int *piVar3;
  Cond *pCVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  int *attrListPtr;
  int *local_20;
  
  RVar2 = QL_Node::GetAttrList(this->prevNode,&local_20,&(this->super_QL_Node).attrsInRecSize);
  if (RVar2 == 0) {
    lVar7 = (long)(this->super_QL_Node).attrsInRecSize;
    piVar3 = (int *)malloc(lVar7 * 4);
    (this->super_QL_Node).attrsInRec = piVar3;
    if (0 < lVar7) {
      lVar6 = 0;
      do {
        piVar3[lVar6] = local_20[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar7 != lVar6);
    }
    pCVar4 = (Cond *)malloc((long)numConds * 0x30);
    (this->super_QL_Node).condList = pCVar4;
    if (0 < numConds) {
      lVar7 = 0;
      do {
        pCVar4 = (this->super_QL_Node).condList;
        *(undefined4 *)((long)&pCVar4->offset1 + lVar7) = 0;
        *(undefined8 *)((long)&pCVar4->comparator + lVar7) = 0;
        (&pCVar4->isValue)[lVar7] = true;
        puVar1 = (undefined8 *)((long)&pCVar4->data + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&pCVar4->length2 + lVar7) = 0;
        lVar7 = lVar7 + 0x30;
      } while ((ulong)(uint)numConds * 0x30 != lVar7);
    }
    piVar3 = (int *)malloc((long)numConds << 2);
    (this->super_QL_Node).condsInNode = piVar3;
    RVar2 = 0;
    piVar3[0] = 0;
    piVar3[1] = 0;
    QL_Node::GetTupleLength(this->prevNode,&(this->super_QL_Node).tupleLength);
    pcVar5 = (char *)malloc((long)(this->super_QL_Node).tupleLength);
    this->buffer = pcVar5;
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
    pcVar5[2] = '\0';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    (this->super_QL_Node).listsInitialized = true;
  }
  return RVar2;
}

Assistant:

RC QL_NodeSel::SetUpNode(int numConds){
  RC rc = 0;
  int *attrListPtr;
  if((rc = prevNode.GetAttrList(attrListPtr, attrsInRecSize)))
    return (rc);
  attrsInRec = (int *)malloc(attrsInRecSize*sizeof(int));
  for(int i = 0;  i < attrsInRecSize; i++){
    attrsInRec[i] = attrListPtr[i];
  }

  // allot space for these conditions
  condList = (Cond *)malloc(numConds * sizeof(Cond));
  for(int i= 0; i < numConds; i++){
    condList[i] = {0, NULL, true, NULL, 0, 0, INT};
  }
  condsInNode = (int*)malloc(numConds * sizeof(int));
  memset((void*)condsInNode, 0, sizeof(condsInNode));

  prevNode.GetTupleLength(tupleLength);
  buffer = (char *)malloc(tupleLength); // set up buffer
  memset((void*)buffer, 0, sizeof(buffer));
  listsInitialized = true;
  return (0);
}